

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_pattern(ly_ctx *ctx,char *pattern,pcre **pcre_precomp)

{
  pcre **pppVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  pcre *__ptr;
  long lVar6;
  pcre *precomp;
  char *orig_ptr;
  char *err_msg;
  char *ptr;
  char *perl_regex;
  int count;
  int err_offset;
  int end;
  int start;
  int idx2;
  int idx;
  pcre **pcre_precomp_local;
  char *pattern_local;
  ly_ctx *ctx_local;
  
  perl_regex._0_4_ = 0;
  _idx2 = pcre_precomp;
  pcre_precomp_local = (pcre **)pattern;
  pattern_local = (char *)ctx;
  for (err_msg = strchr(pattern,0x24); err_msg != (char *)0x0; err_msg = strchr(err_msg + 1,0x24)) {
    perl_regex._0_4_ = (int)perl_regex + 1;
  }
  sVar3 = strlen((char *)pcre_precomp_local);
  ptr = (char *)malloc(sVar3 + 4 + (long)(int)perl_regex);
  pppVar1 = pcre_precomp_local;
  if (ptr == (char *)0x0) {
    ly_log((ly_ctx *)pattern_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyp_check_pattern");
    ctx_local._4_4_ = 1;
  }
  else {
    *ptr = '\0';
    err_msg = ptr;
    sVar3 = strlen((char *)pcre_precomp_local);
    iVar2 = strncmp((char *)((long)pppVar1 + (sVar3 - 2)),".*",2);
    if (iVar2 != 0) {
      *err_msg = '(';
      err_msg = err_msg + 1;
    }
    for (precomp = (pcre *)pcre_precomp_local; pppVar1 = pcre_precomp_local, *precomp != (pcre)0x0;
        precomp = precomp + 1) {
      if (*precomp == (pcre)0x24) {
        iVar2 = sprintf(err_msg,"\\$");
        err_msg = err_msg + iVar2;
      }
      else {
        *err_msg = (char)*precomp;
        err_msg = err_msg + 1;
      }
    }
    sVar3 = strlen((char *)pcre_precomp_local);
    iVar2 = strncmp((char *)((long)pppVar1 + (sVar3 - 2)),".*",2);
    if (iVar2 == 0) {
      *err_msg = '\0';
      err_msg = err_msg + 1;
    }
    else {
      iVar2 = sprintf(err_msg,")$");
      err_msg = err_msg + iVar2;
    }
    while (err_msg = strstr(ptr,"\\p{Is"), err_msg != (char *)0x0) {
      err_offset = (int)err_msg - (int)ptr;
      err_msg = strchr(err_msg,0x7d);
      pcVar5 = ptr;
      if (err_msg == (char *)0x0) {
        ly_vlog((ly_ctx *)pattern_local,LYE_INREGEX,LY_VLOG_NONE,(void *)0x0,pcre_precomp_local,
                ptr + (long)err_offset + 2,"unterminated character property");
        free(ptr);
        return 1;
      }
      count = ((int)err_msg - (int)ptr) + 1;
      if (count - err_offset < 0x13) {
        sVar3 = strlen(ptr);
        ptr = (char *)ly_realloc(pcVar5,sVar3 + (long)(0x13 - (count - err_offset)) + 1);
        if (ptr == (char *)0x0) {
          ly_log((ly_ctx *)pattern_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lyp_check_pattern");
          free(ptr);
          return 1;
        }
      }
      start = 0;
      while (lyp_ublock2urange[start][0] != (char *)0x0) {
        pcVar4 = ptr + (long)err_offset + 5;
        pcVar5 = lyp_ublock2urange[start][0];
        sVar3 = strlen(lyp_ublock2urange[start][0]);
        iVar2 = strncmp(pcVar4,pcVar5,sVar3);
        if (iVar2 == 0) break;
        start = start + 1;
      }
      if (lyp_ublock2urange[start][0] == (char *)0x0) {
        ly_vlog((ly_ctx *)pattern_local,LYE_INREGEX,LY_VLOG_NONE,(void *)0x0,pcre_precomp_local,
                ptr + (long)err_offset + 5,"unknown block name");
        free(ptr);
        return 1;
      }
      perl_regex._0_4_ = 0;
      for (end = 0; end < err_offset; end = end + 1) {
        if ((ptr[end] == '[') && ((end == 0 || (ptr[end + -1] != '\\')))) {
          perl_regex._0_4_ = (int)perl_regex + 1;
        }
        if ((ptr[end] == ']') && ((end == 0 || (ptr[end + -1] != '\\')))) {
          perl_regex._0_4_ = (int)perl_regex + -1;
        }
      }
      if ((int)perl_regex == 0) {
        pcVar5 = ptr + (long)err_offset + 0x13;
        pcVar4 = ptr + count;
        sVar3 = strlen(ptr + count);
        memmove(pcVar5,pcVar4,sVar3 + 1);
        lVar6 = (long)err_offset;
        pcVar5 = lyp_ublock2urange[start][1];
        *(undefined8 *)(ptr + lVar6) = *(undefined8 *)pcVar5;
        *(undefined8 *)(ptr + lVar6 + 8) = *(undefined8 *)(pcVar5 + 8);
        *(undefined2 *)(ptr + lVar6 + 0x10) = *(undefined2 *)(pcVar5 + 0x10);
        ptr[lVar6 + 0x12] = pcVar5[0x12];
      }
      else {
        pcVar5 = ptr + (long)err_offset + 0x11;
        pcVar4 = ptr + count;
        sVar3 = strlen(ptr + count);
        memmove(pcVar5,pcVar4,sVar3 + 1);
        lVar6 = (long)err_offset;
        pcVar5 = lyp_ublock2urange[start][1];
        *(undefined8 *)(ptr + lVar6) = *(undefined8 *)(pcVar5 + 1);
        *(undefined8 *)(ptr + lVar6 + 8) = *(undefined8 *)(pcVar5 + 9);
        ptr[lVar6 + 0x10] = pcVar5[0x11];
      }
    }
    __ptr = (pcre *)pcre_compile(ptr,0x1030,&orig_ptr,(long)&perl_regex + 4,0);
    if (__ptr == (pcre *)0x0) {
      ly_vlog((ly_ctx *)pattern_local,LYE_INREGEX,LY_VLOG_NONE,(void *)0x0,pcre_precomp_local,
              ptr + perl_regex._4_4_,orig_ptr);
      free(ptr);
      ctx_local._4_4_ = 1;
    }
    else {
      free(ptr);
      if (_idx2 == (pcre **)0x0) {
        free(__ptr);
      }
      else {
        *_idx2 = __ptr;
      }
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int
lyp_check_pattern(struct ly_ctx *ctx, const char *pattern, pcre **pcre_precomp)
{
    int idx, idx2, start, end, err_offset, count;
    char *perl_regex, *ptr;
    const char *err_msg, *orig_ptr;
    pcre *precomp;

    /*
     * adjust the expression to a Perl equivalent
     *
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs
     */

    /* we need to replace all "$" with "\$", count them now */
    for (count = 0, ptr = strchr(pattern, '$'); ptr; ++count, ptr = strchr(ptr + 1, '$'));

    perl_regex = malloc((strlen(pattern) + 4 + count) * sizeof(char));
    LY_CHECK_ERR_RETURN(!perl_regex, LOGMEM(ctx), EXIT_FAILURE);
    perl_regex[0] = '\0';

    ptr = perl_regex;

    if (strncmp(pattern + strlen(pattern) - 2, ".*", 2)) {
        /* we wil add line-end anchoring */
        ptr[0] = '(';
        ++ptr;
    }

    for (orig_ptr = pattern; orig_ptr[0]; ++orig_ptr) {
        if (orig_ptr[0] == '$') {
            ptr += sprintf(ptr, "\\$");
        } else {
            ptr[0] = orig_ptr[0];
            ++ptr;
        }
    }

    if (strncmp(pattern + strlen(pattern) - 2, ".*", 2)) {
        ptr += sprintf(ptr, ")$");
    } else {
        ptr[0] = '\0';
        ++ptr;
    }

    /* substitute Unicode Character Blocks with exact Character Ranges */
    while ((ptr = strstr(perl_regex, "\\p{Is"))) {
        start = ptr - perl_regex;

        ptr = strchr(ptr, '}');
        if (!ptr) {
            LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + start + 2, "unterminated character property");
            free(perl_regex);
            return EXIT_FAILURE;
        }

        end = (ptr - perl_regex) + 1;

        /* need more space */
        if (end - start < LYP_URANGE_LEN) {
            perl_regex = ly_realloc(perl_regex, strlen(perl_regex) + (LYP_URANGE_LEN - (end - start)) + 1);
            LY_CHECK_ERR_RETURN(!perl_regex, LOGMEM(ctx); free(perl_regex), EXIT_FAILURE);
        }

        /* find our range */
        for (idx = 0; lyp_ublock2urange[idx][0]; ++idx) {
            if (!strncmp(perl_regex + start + 5, lyp_ublock2urange[idx][0], strlen(lyp_ublock2urange[idx][0]))) {
                break;
            }
        }
        if (!lyp_ublock2urange[idx][0]) {
            LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + start + 5, "unknown block name");
            free(perl_regex);
            return EXIT_FAILURE;
        }

        /* make the space in the string and replace the block (but we cannot include brackets if it was already enclosed in them) */
        for (idx2 = 0, count = 0; idx2 < start; ++idx2) {
            if ((perl_regex[idx2] == '[') && (!idx2 || (perl_regex[idx2 - 1] != '\\'))) {
                ++count;
            }
            if ((perl_regex[idx2] == ']') && (!idx2 || (perl_regex[idx2 - 1] != '\\'))) {
                --count;
            }
        }
        if (count) {
            /* skip brackets */
            memmove(perl_regex + start + (LYP_URANGE_LEN - 2), perl_regex + end, strlen(perl_regex + end) + 1);
            memcpy(perl_regex + start, lyp_ublock2urange[idx][1] + 1, LYP_URANGE_LEN - 2);
        } else {
            memmove(perl_regex + start + LYP_URANGE_LEN, perl_regex + end, strlen(perl_regex + end) + 1);
            memcpy(perl_regex + start, lyp_ublock2urange[idx][1], LYP_URANGE_LEN);
        }
    }

    /* must return 0, already checked during parsing */
    precomp = pcre_compile(perl_regex, PCRE_ANCHORED | PCRE_DOLLAR_ENDONLY | PCRE_NO_AUTO_CAPTURE,
                           &err_msg, &err_offset, NULL);
    if (!precomp) {
        LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return EXIT_FAILURE;
    }
    free(perl_regex);

    if (pcre_precomp) {
        *pcre_precomp = precomp;
    } else {
        free(precomp);
    }

    return EXIT_SUCCESS;
}